

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->reconstructedExpression)._M_string_length == 0) &&
     ((this->lazyExpression).m_transientExpression != (ITransientExpression *)0x0)) {
    ReusableStringStream::ReusableStringStream(&local_60);
    Catch::operator<<(local_60.m_oss,&this->lazyExpression);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->reconstructedExpression,local_48);
    std::__cxx11::string::~string(local_48);
    ReusableStringStream::~ReusableStringStream(&local_60);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->reconstructedExpression);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }